

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_nojit.c
# Opt level: O1

void raviV_dumpIR(lua_State *L,Proto *p)

{
  _Bool _Var1;
  ravi_compile_options_t options;
  membuff_t buf;
  char fname [30];
  ravi_compile_options_t local_58;
  membuff_t local_50;
  char local_38 [32];
  
  membuff_init(&local_50,0x1000);
  builtin_strncpy(local_38,"jitfunction",0xc);
  local_58 = (ravi_compile_options_t)0x300000000;
  _Var1 = raviJ_codegen(L,p,&local_58,local_38,&local_50);
  if (_Var1) {
    puts(local_50.buf);
  }
  membuff_free(&local_50);
  return;
}

Assistant:

void raviV_dumpIR(struct lua_State *L, struct Proto *p) {
  membuff_t buf;
  membuff_init(&buf, 4096);

  // TODO enhance this to allow user to specify name
  // and also whether to dump header or body or both
  char fname[30];
  snprintf(fname, sizeof fname, "jitfunction");
  ravi_compile_options_t options = {0, 0, 0, RAVI_CODEGEN_ALL};
  if (raviJ_codegen(L, p, &options, fname, &buf)) { puts(buf.buf); }
  membuff_free(&buf);
}